

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# book.cpp
# Opt level: O0

ostream * operator<<(ostream *os,Book *book)

{
  ostream *poVar1;
  string local_88;
  string local_68;
  string local_38;
  Book *local_18;
  Book *book_local;
  ostream *os_local;
  
  local_18 = book;
  book_local = (Book *)os;
  Book::get_title_abi_cxx11_(&local_38,book);
  poVar1 = std::operator<<(os,(string *)&local_38);
  poVar1 = std::operator<<(poVar1,'\n');
  Book::get_author_abi_cxx11_(&local_68,local_18);
  poVar1 = std::operator<<(poVar1,(string *)&local_68);
  poVar1 = std::operator<<(poVar1,'\n');
  Book::get_isbn_abi_cxx11_(&local_88,local_18);
  poVar1 = std::operator<<(poVar1,(string *)&local_88);
  std::operator<<(poVar1,'\n');
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_38);
  return (ostream *)book_local;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Book& book)
{
	os << book.get_title()
		<< '\n' << book.get_author()
		<< '\n' << book.get_isbn()
		<< '\n';
	return os;
}